

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_info.cc
# Opt level: O2

int main(int argc,char **argv)

{
  Interface *this;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  string *psVar7;
  int64_t iVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  undefined8 extraout_RDX_01;
  ulong uVar10;
  size_t i;
  ulong uVar11;
  char *pcVar12;
  Interface *this_00;
  char cVar13;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *this_01;
  size_t i_1;
  long lVar14;
  ulong uVar15;
  shared_ptr<rcg::Device> sVar16;
  int local_170;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> interf;
  string devid;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> system;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  interf_1;
  char *local_e0;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> device_1;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> device;
  int local_7c;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> system_1;
  string local_50;
  
  if (1 < argc) {
    std::__cxx11::string::string((string *)&devid,argv[1],(allocator *)&system);
    bVar2 = std::operator!=(&devid,"-h");
    std::__cxx11::string::~string((string *)&devid);
    if (bVar2) {
      std::__cxx11::string::string((string *)&devid,argv[1],(allocator *)&interf);
      bVar2 = std::operator==(&devid,"-L");
      if (bVar2) {
        std::__cxx11::string::~string((string *)&devid);
LAB_0010819f:
        std::__cxx11::string::string((string *)&devid,argv[1],(allocator *)&system);
        pcVar12 = "-L";
        bVar2 = std::operator==(&devid,"-L");
        std::__cxx11::string::~string((string *)&devid);
        rcg::System::getSystems();
        for (uVar10 = 0;
            uVar10 < (ulong)((long)system.
                                   super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)system.
                                   super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
            uVar10 = uVar10 + 1) {
          rcg::System::open(system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            pcVar12,(int)uVar10 * 0x10);
          poVar6 = std::operator<<((ostream *)&std::cout,"Transport Layer ");
          rcg::System::getID_abi_cxx11_
                    (&devid,system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = std::operator<<(poVar6,(string *)&devid);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&devid);
          poVar6 = std::operator<<((ostream *)&std::cout,"Vendor:         ");
          rcg::System::getVendor_abi_cxx11_
                    (&devid,system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = std::operator<<(poVar6,(string *)&devid);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&devid);
          poVar6 = std::operator<<((ostream *)&std::cout,"Model:          ");
          rcg::System::getModel_abi_cxx11_
                    (&devid,system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = std::operator<<(poVar6,(string *)&devid);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&devid);
          poVar6 = std::operator<<((ostream *)&std::cout,"Vendor version: ");
          rcg::System::getVersion_abi_cxx11_
                    (&devid,system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = std::operator<<(poVar6,(string *)&devid);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&devid);
          poVar6 = std::operator<<((ostream *)&std::cout,"TL type:        ");
          rcg::System::getTLType_abi_cxx11_
                    (&devid,system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = std::operator<<(poVar6,(string *)&devid);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&devid);
          poVar6 = std::operator<<((ostream *)&std::cout,"Name:           ");
          rcg::System::getName_abi_cxx11_
                    (&devid,system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = std::operator<<(poVar6,(string *)&devid);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&devid);
          poVar6 = std::operator<<((ostream *)&std::cout,"Pathname:       ");
          rcg::System::getPathname_abi_cxx11_
                    (&devid,system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = std::operator<<(poVar6,(string *)&devid);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&devid);
          poVar6 = std::operator<<((ostream *)&std::cout,"Display name:   ");
          rcg::System::getDisplayName_abi_cxx11_
                    (&devid,system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = std::operator<<(poVar6,(string *)&devid);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&devid);
          poVar6 = std::operator<<((ostream *)&std::cout,"GenTL version   ");
          iVar5 = rcg::System::getMajorVersion
                            (system.
                             super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                             super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar5);
          poVar6 = std::operator<<(poVar6,".");
          iVar5 = rcg::System::getMinorVersion
                            (system.
                             super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                             super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar5);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          pcVar12 = (char *)system.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          rcg::System::getInterfaces(&interf,(System *)pcVar12);
          uVar9 = extraout_RDX;
          if (bVar2) {
            rcg::System::getNodeMap((System *)&devid);
            pcVar12 = "Root";
            rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&devid,"Root",100,true);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&devid._M_string_length);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            uVar9 = extraout_RDX_00;
          }
          for (uVar11 = 0;
              uVar11 < (ulong)((long)interf.
                                     super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)interf.
                                     super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
              uVar11 = uVar11 + 1) {
            rcg::Interface::open
                      (interf.
                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11].
                       super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pcVar12
                       ,(int)uVar9);
            poVar6 = std::operator<<((ostream *)&std::cout,"    Interface     ");
            psVar7 = rcg::Interface::getID_abi_cxx11_
                               (interf.
                                super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
            poVar6 = std::operator<<(poVar6,(string *)psVar7);
            std::endl<char,std::char_traits<char>>(poVar6);
            poVar6 = std::operator<<((ostream *)&std::cout,"    Display name: ");
            rcg::Interface::getDisplayName_abi_cxx11_
                      (&devid,interf.
                              super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].
                              super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            poVar6 = std::operator<<(poVar6,(string *)&devid);
            std::endl<char,std::char_traits<char>>(poVar6);
            std::__cxx11::string::~string((string *)&devid);
            poVar6 = std::operator<<((ostream *)&std::cout,"    TL type:      ");
            rcg::Interface::getTLType_abi_cxx11_
                      (&devid,interf.
                              super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].
                              super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            poVar6 = std::operator<<(poVar6,(string *)&devid);
            std::endl<char,std::char_traits<char>>(poVar6);
            std::__cxx11::string::~string((string *)&devid);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            pcVar12 = (char *)interf.
                              super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].
                              super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            rcg::Interface::getDevices(&device,(Interface *)pcVar12);
            if (bVar2) {
              rcg::Interface::getNodeMap((Interface *)&devid);
              pcVar12 = "Root";
              rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&devid,"Root",100,true);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&devid._M_string_length);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            }
            lVar14 = 0;
            for (uVar15 = 0;
                uVar15 < (ulong)((long)device.
                                       super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)device.
                                       super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4);
                uVar15 = uVar15 + 1) {
              poVar6 = std::operator<<((ostream *)&std::cout,"        Device             ");
              psVar7 = rcg::Device::getID_abi_cxx11_
                                 (*(Device **)
                                   ((long)&((device.
                                             super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)psVar7);
              std::endl<char,std::char_traits<char>>(poVar6);
              poVar6 = std::operator<<((ostream *)&std::cout,"        Vendor:            ");
              rcg::Device::getVendor_abi_cxx11_
                        (&devid,*(Device **)
                                 ((long)&((device.
                                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&devid);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&devid);
              poVar6 = std::operator<<((ostream *)&std::cout,"        Model:             ");
              rcg::Device::getModel_abi_cxx11_
                        (&devid,*(Device **)
                                 ((long)&((device.
                                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&devid);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&devid);
              poVar6 = std::operator<<((ostream *)&std::cout,"        TL type:           ");
              rcg::Device::getTLType_abi_cxx11_
                        (&devid,*(Device **)
                                 ((long)&((device.
                                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&devid);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&devid);
              poVar6 = std::operator<<((ostream *)&std::cout,"        Display name:      ");
              rcg::Device::getDisplayName_abi_cxx11_
                        (&devid,*(Device **)
                                 ((long)&((device.
                                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&devid);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&devid);
              poVar6 = std::operator<<((ostream *)&std::cout,"        User defined name: ");
              rcg::Device::getUserDefinedName_abi_cxx11_
                        (&devid,*(Device **)
                                 ((long)&((device.
                                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&devid);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&devid);
              poVar6 = std::operator<<((ostream *)&std::cout,"        Access status:     ");
              rcg::Device::getAccessStatus_abi_cxx11_
                        (&devid,*(Device **)
                                 ((long)&((device.
                                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&devid);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&devid);
              poVar6 = std::operator<<((ostream *)&std::cout,"        Serial number:     ");
              rcg::Device::getSerialNumber_abi_cxx11_
                        (&devid,*(Device **)
                                 ((long)&((device.
                                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&devid);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&devid);
              poVar6 = std::operator<<((ostream *)&std::cout,"        Version:           ");
              rcg::Device::getVersion_abi_cxx11_
                        (&devid,*(Device **)
                                 ((long)&((device.
                                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&devid);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&devid);
              poVar6 = std::operator<<((ostream *)&std::cout,"        TS Frequency:      ");
              pcVar12 = (char *)rcg::Device::getTimestampFrequency
                                          (*(Device **)
                                            ((long)&((device.
                                                  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar14));
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              lVar14 = lVar14 + 0x10;
            }
            rcg::Interface::close
                      (interf.
                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11].
                       super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (int)pcVar12);
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            ~vector(&device);
            uVar9 = extraout_RDX_01;
          }
          rcg::System::close(system.
                             super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                             super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             (int)pcVar12);
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::~vector(&interf);
        }
        this_01 = &system;
      }
      else {
        std::__cxx11::string::string((string *)&system,argv[1],(allocator *)&device);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&system,"-l");
        std::__cxx11::string::~string((string *)&system);
        std::__cxx11::string::~string((string *)&devid);
        if (bVar2) goto LAB_0010819f;
        std::__cxx11::string::string((string *)&devid,argv[1],(allocator *)&system);
        bVar2 = std::operator==(&devid,"-s");
        std::__cxx11::string::~string((string *)&devid);
        if (!bVar2) {
          local_170 = -1;
          uVar10 = 1;
          local_e0 = (char *)0x0;
          bVar1 = false;
          bVar2 = false;
LAB_00108c46:
          uVar10 = (long)(int)uVar10;
LAB_00108c4c:
          uVar11 = uVar10;
          uVar10 = uVar11 + 1;
          iVar5 = (int)uVar10;
          if ((argc <= iVar5) || (*argv[uVar11] != '-')) {
            if (iVar5 + -1 < argc) {
              std::__cxx11::string::string((string *)&devid,argv[uVar11],(allocator *)&system);
              std::__cxx11::string::string((string *)&system,"Root",(allocator *)&interf);
              lVar14 = std::__cxx11::string::find((char)&devid,0x3f);
              local_7c = 1000;
              bVar3 = true;
              if (lVar14 != -1) {
                std::__cxx11::string::substr((ulong)&interf,(ulong)&devid);
                bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&interf,"-");
                std::__cxx11::string::~string((string *)&interf);
                if (bVar4) {
                  std::__cxx11::string::substr((ulong)&interf,(ulong)&devid);
                  std::__cxx11::string::operator=((string *)&system,(string *)&interf);
                  std::__cxx11::string::~string((string *)&interf);
                  std::__cxx11::string::substr((ulong)&interf,(ulong)&devid);
                  std::__cxx11::string::operator=((string *)&devid,(string *)&interf);
                  std::__cxx11::string::~string((string *)&interf);
                  local_7c = 1;
                  if (system.
                      super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
                    std::__cxx11::string::assign((char *)&system);
                  }
                  bVar3 = false;
                }
                else {
                  std::__cxx11::string::assign((char *)&system);
                  std::__cxx11::string::substr((ulong)&interf,(ulong)&devid);
                  std::__cxx11::string::operator=((string *)&devid,(string *)&interf);
                  std::__cxx11::string::~string((string *)&interf);
                }
              }
              sVar16 = rcg::getDevice((rcg *)&interf_1,devid._M_dataplus._M_p);
              if (interf_1.
                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                poVar6 = std::operator<<((ostream *)&std::cerr,"Device \'");
                poVar6 = std::operator<<(poVar6,(string *)&devid);
                poVar6 = std::operator<<(poVar6,"\' not found!");
                std::endl<char,std::char_traits<char>>(poVar6);
                iVar5 = 1;
              }
              else {
                rcg::Device::open((Device *)
                                  interf_1.
                                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (char *)(ulong)(byte)(iVar5 < argc | bVar2 |
                                                       local_e0 != (char *)0x0),
                                  (int)sVar16.
                                       super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi);
                device_1.
                super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                device_1.
                super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                if (bVar1) {
                  rcg::Device::getNodeMap
                            ((Device *)&interf,
                             (char *)interf_1.
                                     super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  rcg::Device::getRemoteNodeMap
                            ((Device *)&interf,
                             (char *)interf_1.
                                     super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                }
                std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)
                           &device_1,
                           (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)
                           &interf);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &interf.
                            super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
                if (-1 < local_170) {
                  rcg::Device::enableModuleEvents
                            ((Device *)
                             interf_1.
                             super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
                  device.
                  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  device.
                  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  rcg::Device::getNodeMap
                            ((Device *)&interf,
                             (char *)interf_1.
                                     super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)
                             &device,(__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                                      *)&interf);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &interf.
                              super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
                  interf.
                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  interf.
                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  interf.
                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  rcg::getEnum(&local_50,(shared_ptr<GenApi_3_4::CNodeMapRef> *)&device,
                               "EventSelector",
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&interf,false);
                  std::__cxx11::string::~string((string *)&local_50);
                  lVar14 = 0;
                  for (uVar11 = 0;
                      uVar11 < (ulong)((long)interf.
                                             super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)interf.
                                             super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
                      uVar11 = uVar11 + 1) {
                    rcg::setEnum((shared_ptr<GenApi_3_4::CNodeMapRef> *)&device,"EventSelector",
                                 *(char **)((long)&((interf.
                                                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar14),true);
                    rcg::setEnum((shared_ptr<GenApi_3_4::CNodeMapRef> *)&device,"EventNotification",
                                 "On",false);
                    lVar14 = lVar14 + 0x20;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&interf);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &device.
                              super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
                }
                if (device_1.
                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                  local_e0 = "Nodemap not available!";
                  poVar6 = std::operator<<((ostream *)&std::cerr,"Nodemap not available!");
                  iVar5 = 0;
                  std::endl<char,std::char_traits<char>>(poVar6);
                }
                else {
                  for (; (long)uVar10 < (long)(ulong)(uint)argc; uVar10 = uVar10 + 1) {
                    std::__cxx11::string::string
                              ((string *)&interf,argv[uVar10],(allocator *)&device);
                    if ((interf.
                         super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) ||
                       (*(char *)&((interf.
                                    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr != '@')) {
                      cVar13 = (char)(string *)&interf;
                      lVar14 = std::__cxx11::string::find(cVar13,0x3d);
                      if (lVar14 != -1) {
                        std::__cxx11::string::find(cVar13,0x3d);
                        std::__cxx11::string::substr((ulong)&device,(ulong)&interf);
                        std::__cxx11::string::substr((ulong)&system_1,(ulong)&interf);
                        rcg::setString((shared_ptr<GenApi_3_4::CNodeMapRef> *)&device_1,
                                       (char *)system_1.
                                               super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                       (char *)device.
                                               super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start,true);
                        std::__cxx11::string::~string((string *)&system_1);
                        goto LAB_001092bc;
                      }
                      rcg::callCommand((shared_ptr<GenApi_3_4::CNodeMapRef> *)&device_1,
                                       (char *)interf.
                                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start,true);
                    }
                    else {
                      std::__cxx11::string::substr((ulong)&device,(ulong)&interf);
                      rcg::loadStreamableParameters
                                ((shared_ptr<GenApi_3_4::CNodeMapRef> *)&device_1,
                                 (char *)device.
                                         super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,true);
LAB_001092bc:
                      std::__cxx11::string::~string((string *)&device);
                    }
                    std::__cxx11::string::~string((string *)&interf);
                  }
                  if (-1 < local_170) {
                    poVar6 = std::operator<<((ostream *)&std::cout,"Waiting for events");
                    std::endl<char,std::char_traits<char>>(poVar6);
                    iVar8 = rcg::Device::getModuleEvent
                                      ((Device *)
                                       interf_1.
                                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       (ulong)(uint)(local_170 * 1000));
                    if (iVar8 < 0) {
                      poVar6 = std::operator<<((ostream *)&std::cout,"Received no module events");
                      std::endl<char,std::char_traits<char>>(poVar6);
                    }
                    while (-1 < iVar8) {
                      poVar6 = std::operator<<((ostream *)&std::cout,
                                               "Received module event with ID: ");
                      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      iVar8 = rcg::Device::getModuleEvent
                                        ((Device *)
                                         interf_1.
                                         super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,0);
                    }
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  }
                  if (bVar2) {
                    bVar2 = rcg::editNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&device_1,
                                             (char *)system.
                                                  super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
LAB_00109705:
                    iVar5 = 0;
                    if (bVar2 == false) {
                      poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown node: ");
                      poVar6 = std::operator<<(poVar6,(string *)&system);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      iVar5 = 1;
                    }
                  }
                  else {
                    iVar5 = 0;
                    if (system.
                        super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                      if (!bVar3) {
                        bVar2 = rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&device_1,
                                                  (char *)system.
                                                  super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,1,true);
                        goto LAB_00109705;
                      }
                      poVar6 = std::operator<<((ostream *)&std::cout,"Device:            ");
                      psVar7 = rcg::Device::getID_abi_cxx11_
                                         ((Device *)
                                          interf_1.
                                          super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::operator<<(poVar6,(string *)psVar7);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      poVar6 = std::operator<<((ostream *)&std::cout,"Vendor:            ");
                      rcg::Device::getVendor_abi_cxx11_
                                ((string *)&interf,
                                 (Device *)
                                 interf_1.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::operator<<(poVar6,(string *)&interf);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__cxx11::string::~string((string *)&interf);
                      poVar6 = std::operator<<((ostream *)&std::cout,"Model:             ");
                      rcg::Device::getModel_abi_cxx11_
                                ((string *)&interf,
                                 (Device *)
                                 interf_1.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::operator<<(poVar6,(string *)&interf);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__cxx11::string::~string((string *)&interf);
                      poVar6 = std::operator<<((ostream *)&std::cout,"TL type:           ");
                      rcg::Device::getTLType_abi_cxx11_
                                ((string *)&interf,
                                 (Device *)
                                 interf_1.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::operator<<(poVar6,(string *)&interf);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__cxx11::string::~string((string *)&interf);
                      poVar6 = std::operator<<((ostream *)&std::cout,"Display name:      ");
                      rcg::Device::getDisplayName_abi_cxx11_
                                ((string *)&interf,
                                 (Device *)
                                 interf_1.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::operator<<(poVar6,(string *)&interf);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__cxx11::string::~string((string *)&interf);
                      poVar6 = std::operator<<((ostream *)&std::cout,"User defined name: ");
                      rcg::Device::getUserDefinedName_abi_cxx11_
                                ((string *)&interf,
                                 (Device *)
                                 interf_1.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::operator<<(poVar6,(string *)&interf);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__cxx11::string::~string((string *)&interf);
                      poVar6 = std::operator<<((ostream *)&std::cout,"Serial number:     ");
                      rcg::Device::getSerialNumber_abi_cxx11_
                                ((string *)&interf,
                                 (Device *)
                                 interf_1.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::operator<<(poVar6,(string *)&interf);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__cxx11::string::~string((string *)&interf);
                      poVar6 = std::operator<<((ostream *)&std::cout,"Version:           ");
                      rcg::Device::getVersion_abi_cxx11_
                                ((string *)&interf,
                                 (Device *)
                                 interf_1.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::operator<<(poVar6,(string *)&interf);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__cxx11::string::~string((string *)&interf);
                      poVar6 = std::operator<<((ostream *)&std::cout,"TS Frequency:      ");
                      rcg::Device::getTimestampFrequency
                                ((Device *)
                                 interf_1.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                      rcg::Device::getStreams
                                ((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                  *)&interf,
                                 (Device *)
                                 interf_1.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      poVar6 = std::operator<<((ostream *)&std::cout,"Available streams:");
                      std::endl<char,std::char_traits<char>>(poVar6);
                      lVar14 = 0;
                      for (uVar10 = 0;
                          uVar10 < (ulong)((long)interf.
                                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)interf.
                                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
                          uVar10 = uVar10 + 1) {
                        poVar6 = std::operator<<((ostream *)&std::cout,"  Stream ID: ");
                        psVar7 = rcg::Stream::getID_abi_cxx11_
                                           (*(Stream **)
                                             ((long)&((interf.
                                                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar14));
                        poVar6 = std::operator<<(poVar6,(string *)psVar7);
                        std::endl<char,std::char_traits<char>>(poVar6);
                        lVar14 = lVar14 + 0x10;
                      }
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                      pcVar12 = "Remote device nodemap:";
                      if (bVar1) {
                        pcVar12 = "Local device nodemap:";
                      }
                      poVar6 = std::operator<<((ostream *)&std::cout,pcVar12);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&device_1,
                                        (char *)system.
                                                super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start,local_7c,
                                        true);
                      std::
                      vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                      ::~vector((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                 *)&interf);
                      iVar5 = 0;
                    }
                  }
                  if (local_e0 != (char *)0x0) {
                    rcg::saveStreamableParameters
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)&device_1,local_e0,true);
                  }
                }
                rcg::Device::close((Device *)
                                   interf_1.
                                   super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(int)local_e0);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &device_1.
                            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &interf_1.
                          super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
              std::__cxx11::string::~string((string *)&system);
              std::__cxx11::string::~string((string *)&devid);
              goto LAB_0010813f;
            }
            poVar6 = std::operator<<((ostream *)&std::cerr,"Device name not given!");
            goto LAB_00108f8f;
          }
          std::__cxx11::string::string((string *)&devid,argv[uVar11],(allocator *)&system);
          bVar3 = std::operator==(&devid,"-o");
          std::__cxx11::string::~string((string *)&devid);
          if (bVar3) {
            std::__cxx11::string::string((string *)&devid,argv[uVar10],(allocator *)&system);
            uVar10 = (ulong)(iVar5 + 1);
            std::operator==(&devid,".");
            std::__cxx11::string::~string((string *)&devid);
          }
          else {
            std::__cxx11::string::string((string *)&devid,argv[uVar11],(allocator *)&system);
            bVar3 = std::operator==(&devid,"-m");
            std::__cxx11::string::~string((string *)&devid);
            if (bVar3) {
              std::__cxx11::string::string((string *)&devid,argv[uVar10],(allocator *)&system);
              local_170 = std::__cxx11::stoi(&devid,(size_t *)0x0,10);
              uVar10 = uVar11 + 2;
              std::__cxx11::string::~string((string *)&devid);
            }
            else {
              std::__cxx11::string::string((string *)&devid,argv[uVar11],(allocator *)&system);
              bVar3 = std::operator==(&devid,"-p");
              std::__cxx11::string::~string((string *)&devid);
              if (bVar3) {
                local_e0 = argv[uVar10];
                uVar10 = (ulong)(iVar5 + 1);
              }
              else {
                std::__cxx11::string::string((string *)&devid,argv[uVar11],(allocator *)&system);
                bVar3 = std::operator==(&devid,"-d");
                std::__cxx11::string::~string((string *)&devid);
                if (!bVar3) goto code_r0x00108d2a;
                bVar1 = true;
              }
            }
          }
          goto LAB_00108c46;
        }
        rcg::System::getSystems();
        pcVar12 = "Interface\tSerial Number\tVendor\tModel\tName";
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "Interface\tSerial Number\tVendor\tModel\tName");
        std::endl<char,std::char_traits<char>>(poVar6);
        for (uVar10 = 0;
            uVar10 < (ulong)((long)system_1.
                                   super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)system_1.
                                   super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
            uVar10 = uVar10 + 1) {
          rcg::System::open(system_1.
                            super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            pcVar12,(int)uVar10);
          rcg::System::getInterfaces
                    (&interf_1,
                     system_1.
                     super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].
                     super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          for (pcVar12 = (char *)0x0;
              pcVar12 < (char *)((long)interf_1.
                                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)interf_1.
                                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4);
              pcVar12 = pcVar12 + 1) {
            rcg::Interface::open
                      (interf_1.
                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pcVar12].
                       super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pcVar12
                       ,(int)uVar10 * 0x10);
            this_00 = interf_1.
                      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pcVar12].
                      super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            rcg::Interface::getDevices(&device_1,this_00);
            lVar14 = 0;
            for (uVar11 = 0;
                this = interf_1.
                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pcVar12].
                       super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                uVar11 < (ulong)((long)device_1.
                                       super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)device_1.
                                       super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4);
                uVar11 = uVar11 + 1) {
              psVar7 = rcg::Interface::getID_abi_cxx11_(this);
              poVar6 = std::operator<<((ostream *)&std::cout,(string *)psVar7);
              poVar6 = std::operator<<(poVar6,'\t');
              rcg::Device::getSerialNumber_abi_cxx11_
                        (&devid,*(Device **)
                                 ((long)&((device_1.
                                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&devid);
              poVar6 = std::operator<<(poVar6,'\t');
              rcg::Device::getVendor_abi_cxx11_
                        ((string *)&system,
                         *(Device **)
                          ((long)&((device_1.
                                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&system);
              poVar6 = std::operator<<(poVar6,'\t');
              rcg::Device::getModel_abi_cxx11_
                        ((string *)&interf,
                         *(Device **)
                          ((long)&((device_1.
                                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)&interf);
              poVar6 = std::operator<<(poVar6,'\t');
              this_00 = (Interface *)&device;
              rcg::Device::getDisplayName_abi_cxx11_
                        ((string *)this_00,
                         *(Device **)
                          ((long)&((device_1.
                                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr + lVar14));
              poVar6 = std::operator<<(poVar6,(string *)this_00);
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&device);
              std::__cxx11::string::~string((string *)&interf);
              std::__cxx11::string::~string((string *)&system);
              std::__cxx11::string::~string((string *)&devid);
              lVar14 = lVar14 + 0x10;
            }
            rcg::Interface::close(this,(int)this_00);
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            ~vector(&device_1);
          }
          rcg::System::close(system_1.
                             super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                             super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             (int)pcVar12);
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::~vector(&interf_1);
        }
        this_01 = &system_1;
      }
      std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
      ~vector(this_01);
      iVar5 = 0;
      goto LAB_0010813f;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,*argv);
  poVar6 = std::operator<<(poVar6,
                           " -h | -L | -l | -s | ([-o <xml-output-file>|.] [-m <timeout>] [-p <file>] [-d] [-e] [<interface-id>:]<device-id>[?<node>] [@<file>] [<key>=<value>] ...)"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Provides information about GenICam transport layers, interfaces and devices."
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar6 = std::operator<<((ostream *)&std::cout,"Options: ");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"-h   Prints help information and exits");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "-L   List all available devices on all interfaces (extended format)");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"-l   List all available devices on all interfaces"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "-s   List all available devices on all interfaces (short format)");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"-o   Store XML description from specified device")
  ;
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "-m   Registers for module events and waits for the given number of seconds for such events"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "-d   Use local device nodemap, instead of remote nodemap");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "-e   Open nodemap editor instead of printing nodemap");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "-p   Store all streamable parameters to the given file, after applying all parameters"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar6 = std::operator<<((ostream *)&std::cout,"Parameters:");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "<interface-id> Optional GenICam ID of interface for connecting to the device"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "<device-id>    GenICam device ID, serial number or user defined name of device"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "<node>         Optional name of category or parameter to be reported. \'-\' for none. Default is \'Root\'."
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "@<file>        Optional file with parameters as store with parameter \'-p\'"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "<key>=<value>  Optional GenICam parameters to be changed in the given order before reporting"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_0010813c:
  iVar5 = 1;
LAB_0010813f:
  rcg::System::clearSystems();
  return iVar5;
code_r0x00108d2a:
  std::__cxx11::string::string((string *)&devid,argv[uVar11],(allocator *)&system);
  bVar3 = std::operator==(&devid,"-e");
  std::__cxx11::string::~string((string *)&devid);
  bVar2 = true;
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown parameter: ");
    poVar6 = std::operator<<(poVar6,argv[uVar11]);
LAB_00108f8f:
    std::endl<char,std::char_traits<char>>(poVar6);
    goto LAB_0010813c;
  }
  goto LAB_00108c4c;
}

Assistant:

int main(int argc, char *argv[])
{
  int ret=0;

  try
  {
    if (argc >= 2 && std::string(argv[1]) != "-h")
    {
      if (std::string(argv[1]) == "-L" || std::string(argv[1]) == "-l")
      {
        bool extended=(std::string(argv[1]) == "-L");

        // list all systems, interfaces and devices

        std::vector<std::shared_ptr<rcg::System> > system=rcg::System::getSystems();

        for (size_t i=0; i<system.size(); i++)
        {
          system[i]->open();

          std::cout << "Transport Layer " << system[i]->getID() << std::endl;
          std::cout << "Vendor:         " << system[i]->getVendor() << std::endl;
          std::cout << "Model:          " << system[i]->getModel() << std::endl;
          std::cout << "Vendor version: " << system[i]->getVersion() << std::endl;
          std::cout << "TL type:        " << system[i]->getTLType() << std::endl;
          std::cout << "Name:           " << system[i]->getName() << std::endl;
          std::cout << "Pathname:       " << system[i]->getPathname() << std::endl;
          std::cout << "Display name:   " << system[i]->getDisplayName() << std::endl;
          std::cout << "GenTL version   " << system[i]->getMajorVersion() << "."
                    << system[i]->getMinorVersion() << std::endl;
          std::cout << std::endl;

          std::vector<std::shared_ptr<rcg::Interface> > interf=system[i]->getInterfaces();

          if (extended)
          {
            rcg::printNodemap(system[i]->getNodeMap(), "Root");
            std::cout << std::endl;
          }

          for (size_t k=0; k<interf.size(); k++)
          {
            interf[k]->open();

            std::cout << "    Interface     " << interf[k]->getID() << std::endl;
            std::cout << "    Display name: " << interf[k]->getDisplayName() << std::endl;
            std::cout << "    TL type:      " << interf[k]->getTLType() << std::endl;
            std::cout << std::endl;

            std::vector<std::shared_ptr<rcg::Device> > device=interf[k]->getDevices();

            if (extended)
            {
              rcg::printNodemap(interf[k]->getNodeMap(), "Root");
              std::cout << std::endl;
            }

            for (size_t j=0; j<device.size(); j++)
            {
              std::cout << "        Device             " << device[j]->getID() << std::endl;
              std::cout << "        Vendor:            " << device[j]->getVendor() << std::endl;
              std::cout << "        Model:             " << device[j]->getModel() << std::endl;
              std::cout << "        TL type:           " << device[j]->getTLType() << std::endl;
              std::cout << "        Display name:      " << device[j]->getDisplayName() << std::endl;
              std::cout << "        User defined name: " << device[j]->getUserDefinedName() << std::endl;
              std::cout << "        Access status:     " << device[j]->getAccessStatus() << std::endl;
              std::cout << "        Serial number:     " << device[j]->getSerialNumber() << std::endl;
              std::cout << "        Version:           " << device[j]->getVersion() << std::endl;
              std::cout << "        TS Frequency:      " << device[j]->getTimestampFrequency() << std::endl;
              std::cout << std::endl;
            }

            interf[k]->close();
          }

          system[i]->close();
        }
      }
      else if (std::string(argv[1]) == "-s")
      {
        // list all systems, interfaces and devices

        std::vector<std::shared_ptr<rcg::System> > system=rcg::System::getSystems();

        std::cout << "Interface\tSerial Number\tVendor\tModel\tName" << std::endl;

        for (size_t i=0; i<system.size(); i++)
        {
          system[i]->open();

          std::vector<std::shared_ptr<rcg::Interface> > interf=system[i]->getInterfaces();

          for (size_t k=0; k<interf.size(); k++)
          {
            interf[k]->open();

            std::vector<std::shared_ptr<rcg::Device> > device=interf[k]->getDevices();

            for (size_t j=0; j<device.size(); j++)
            {
              std::cout << interf[k]->getID() << '\t'
                        << device[j]->getSerialNumber() << '\t'
                        << device[j]->getVendor() << '\t'
                        << device[j]->getModel() << '\t'
                        << device[j]->getDisplayName() << std::endl;
            }

            interf[k]->close();
          }

          system[i]->close();
        }
      }
      else
      {
        int k=1;

        // get parameters, if any

        int module_event_timeout=-1;
        const char *xml=0;
        const char *paramfile=0;
        bool local_nodemap=false;
        bool edit=false;

        while (k+1 < argc && argv[k][0] == '-')
        {
          if (std::string(argv[k]) == "-o")
          {
            k++;
            xml=argv[k++];

            if (std::string(xml) == ".")
            {
              xml="";
            }
          }
          else if (std::string(argv[k]) == "-m")
          {
            k++;
            module_event_timeout=std::stoi(std::string(argv[k++]));
          }
          else if (std::string(argv[k]) == "-p")
          {
            k++;
            paramfile=argv[k++];
          }
          else if (std::string(argv[k]) == "-d")
          {
            k++;
            local_nodemap=true;
          }
          else if (std::string(argv[k]) == "-e")
          {
            k++;
            edit=true;
          }
          else
          {
            std::cerr << "Unknown parameter: " << argv[k] << std::endl;
            ret=1;
            break;
          }
        }

        if (ret == 0)
        {
          if (k < argc)
          {
            // separate optional node name from device id

            std::string devid=argv[k++];
            std::string node="Root";
            int depth=1000;

            {
              size_t j=devid.find('?');

              if (j != std::string::npos)
              {
                if (devid.substr(j+1) != "-")
                {
                  node=devid.substr(j+1);
                  devid=devid.substr(0, j);
                  depth=1;

                  if (node.size() == 0)
                  {
                    node="Root";
                  }
                }
                else
                {
                  node="";
                  devid=devid.substr(0, j);
                }
              }
            }

            // find specific device accross all systems and interfaces

            std::shared_ptr<rcg::Device> dev=rcg::getDevice(devid.c_str());

            if (dev)
            {
              // open device and optionally change some settings

              if (k < argc || edit || paramfile)
              {
                dev->open(rcg::Device::CONTROL);
              }
              else
              {
                dev->open(rcg::Device::READONLY);
              }

              // get nodemap

              std::shared_ptr<GenApi::CNodeMapRef> nodemap;
              if (local_nodemap)
              {
                nodemap=dev->getNodeMap(xml);
              }
              else
              {
                nodemap=dev->getRemoteNodeMap(xml);
              }

              // register and enable module events

              if (module_event_timeout >= 0)
              {
                dev->enableModuleEvents();

                std::shared_ptr<GenApi::CNodeMapRef> lnodemap;
                lnodemap=dev->getNodeMap();

                std::vector<std::string> list;
                rcg::getEnum(lnodemap, "EventSelector", list, false);

                for (size_t i=0; i<list.size(); i++)
                {
                  rcg::setEnum(lnodemap, "EventSelector", list[i].c_str(), true);
                  rcg::setEnum(lnodemap, "EventNotification", "On", false);
                }
              }

              if (nodemap)
              {
                // interpret all remaining parameters

                while (k < argc)
                {
                  std::string p=argv[k++];

                  if (p.size() > 0 && p[0] == '@')
                  {
                    // load streamable parameters from file into nodemap

                    rcg::loadStreamableParameters(nodemap, p.substr(1).c_str(), true);
                  }
                  else if (p.find('=') != std::string::npos)
                  {
                    // split argument in key and value

                    size_t j=p.find('=');
                    std::string value=p.substr(j+1);
                    std::string key=p.substr(0, j);

                    // set key=value pair through GenICam

                    rcg::setString(nodemap, key.c_str(), value.c_str(), true);
                  }
                  else
                  {
                    // call the command
                    rcg::callCommand(nodemap, p.c_str(), true);
                  }
                }

                if (module_event_timeout >= 0)
                {
                  std::cout << "Waiting for events" << std::endl;

                  int64_t eventid=dev->getModuleEvent(1000*module_event_timeout);

                  if (eventid < 0)
                  {
                    std::cout << "Received no module events" << std::endl;
                  }

                  while (eventid >= 0)
                  {
                    std::cout << "Received module event with ID: " << eventid << std::endl;
                    eventid=dev->getModuleEvent(0);
                  }

                  std::cout << std::endl;
                }

                if (edit)
                {
                  if (!rcg::editNodemap(nodemap, node.c_str()))
                  {
                    std::cerr << "Unknown node: " << node << std::endl;
                    ret=1;
                  }
                }
                else if (node.size() > 0)
                {
                  if (depth > 1)
                  {
                    // report all features

                    std::cout << "Device:            " << dev->getID() << std::endl;
                    std::cout << "Vendor:            " << dev->getVendor() << std::endl;
                    std::cout << "Model:             " << dev->getModel() << std::endl;
                    std::cout << "TL type:           " << dev->getTLType() << std::endl;
                    std::cout << "Display name:      " << dev->getDisplayName() << std::endl;
                    std::cout << "User defined name: " << dev->getUserDefinedName() << std::endl;
                    std::cout << "Serial number:     " << dev->getSerialNumber() << std::endl;
                    std::cout << "Version:           " << dev->getVersion() << std::endl;
                    std::cout << "TS Frequency:      " << dev->getTimestampFrequency() << std::endl;
                    std::cout << std::endl;

                    std::vector<std::shared_ptr<rcg::Stream> > stream=dev->getStreams();

                    std::cout << "Available streams:" << std::endl;
                    for (size_t i=0; i<stream.size(); i++)
                    {
                      std::cout << "  Stream ID: " << stream[i]->getID() << std::endl;
                    }

                    std::cout << std::endl;

                    if (local_nodemap)
                    {
                      std::cout << "Local device nodemap:" << std::endl;
                    }
                    else
                    {
                      std::cout << "Remote device nodemap:" << std::endl;
                    }

                    rcg::printNodemap(nodemap, node.c_str(), depth, true);
                  }
                  else
                  {
                    // report requested node only

                    if (!rcg::printNodemap(nodemap, node.c_str(), depth, true))
                    {
                      std::cerr << "Unknown node: " << node << std::endl;
                      ret=1;
                    }
                  }
                }

                if (paramfile)
                {
                  rcg::saveStreamableParameters(nodemap, paramfile, true);
                }
              }
              else
              {
                std::cerr << "Nodemap not available!" << std::endl;
              }

              dev->close();
            }
            else
            {
              std::cerr << "Device '" << devid << "' not found!" << std::endl;
              ret=1;
            }
          }
          else
          {
            std::cerr << "Device name not given!" << std::endl;
            ret=1;
          }
        }
      }
    }
    else
    {
      std::cout << argv[0] << " -h | -L | -l | -s | ([-o <xml-output-file>|.] [-m <timeout>] [-p <file>] [-d] [-e] [<interface-id>:]<device-id>[?<node>] [@<file>] [<key>=<value>] ...)" << std::endl;
      std::cout << std::endl;
      std::cout << "Provides information about GenICam transport layers, interfaces and devices." << std::endl;
      std::cout << std::endl;
      std::cout << "Options: " << std::endl;
      std::cout << "-h   Prints help information and exits" << std::endl;
      std::cout << "-L   List all available devices on all interfaces (extended format)" << std::endl;
      std::cout << "-l   List all available devices on all interfaces" << std::endl;
      std::cout << "-s   List all available devices on all interfaces (short format)" << std::endl;
      std::cout << "-o   Store XML description from specified device" << std::endl;
      std::cout << "-m   Registers for module events and waits for the given number of seconds for such events" << std::endl;
      std::cout << "-d   Use local device nodemap, instead of remote nodemap" << std::endl;
      std::cout << "-e   Open nodemap editor instead of printing nodemap" << std::endl;
      std::cout << "-p   Store all streamable parameters to the given file, after applying all parameters" << std::endl;
      std::cout << std::endl;
      std::cout << "Parameters:" << std::endl;
      std::cout << "<interface-id> Optional GenICam ID of interface for connecting to the device" << std::endl;
      std::cout << "<device-id>    GenICam device ID, serial number or user defined name of device" << std::endl;
      std::cout << "<node>         Optional name of category or parameter to be reported. '-' for none. Default is 'Root'." << std::endl;
      std::cout << "@<file>        Optional file with parameters as store with parameter '-p'" << std::endl;
      std::cout << "<key>=<value>  Optional GenICam parameters to be changed in the given order before reporting" << std::endl;
      ret=1;
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
    ret=2;
  }

  rcg::System::clearSystems();

  return ret;
}